

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.c
# Opt level: O3

void oggpack_readinit(oggpack_buffer *b,ogg_reference *r)

{
  *(undefined8 *)b = 0;
  b->headptr = (uchar *)0x0;
  b->headend = 0;
  b->head = r;
  b->tail = r;
  b->count = 0;
  b->headptr = r->buffer->data + r->begin;
  b->headend = r->length;
  _span(b);
  return;
}

Assistant:

void oggpack_readinit(oggpack_buffer *b,ogg_reference *r){
  memset(b,0,sizeof(*b));

  b->tail=b->head=r;
  b->count=0;
  b->headptr=b->head->buffer->data+b->head->begin;
  b->headend=b->head->length;
  _span(b);
}